

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

ModelPtr prepareImportUnitsWithReferenceToNonStandardUnits(string *importUnitsName)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  char *pcVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModelPtr MVar9;
  undefined1 local_418 [8];
  ImporterPtr i;
  AssertHelper local_3e8 [8];
  Message local_3e0 [15];
  bool local_3d1;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_;
  string local_3b8 [39];
  allocator<char> local_391;
  string local_390 [32];
  undefined1 local_370 [8];
  VariablePtr v;
  string local_358 [32];
  undefined1 local_338 [8];
  ComponentPtr c;
  string local_320 [32];
  undefined1 local_300 [8];
  ImportSourcePtr import;
  UnitsPtr u5;
  string local_2d8 [39];
  allocator<char> local_2b1;
  string local_2b0 [39];
  allocator<char> local_289;
  string local_288 [32];
  undefined1 local_268 [8];
  UnitsPtr u4;
  string local_250 [39];
  allocator<char> local_229;
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [32];
  undefined1 local_1e0 [8];
  UnitsPtr u3;
  string local_1c8 [39];
  allocator<char> local_1a1;
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [32];
  undefined1 local_158 [8];
  UnitsPtr u2;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [32];
  undefined1 local_a8 [8];
  UnitsPtr u1;
  string local_90 [32];
  undefined1 local_70 [8];
  ModelPtr model;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  ModelPtr unitsModel;
  string *importUnitsName_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"Units_Database",&local_49);
  libcellml::Model::create((string *)local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"main_model",
             (allocator<char> *)
             ((long)&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Model::create((string *)local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"fmol",&local_c9);
  libcellml::Units::create((string *)local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"mole",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"femto",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_140,"",
             (allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar3,local_f0,1.0,1.0,local_118);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"per_fmol",&local_179);
  libcellml::Units::create((string *)local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"fmol",&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c8,"",
             (allocator<char> *)
             ((long)&u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar3,-1.0,local_1a0);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_200,"per_sec",&local_201);
  libcellml::Units::create((string *)local_1e0);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_228,"second",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_250,"",
             (allocator<char> *)
             ((long)&u4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar3,-1.0,local_228);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u4.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_288,"per_sec_fmol",&local_289);
  libcellml::Units::create((string *)local_268);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator(&local_289);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"per_sec",&local_2b1);
  libcellml::Units::addUnit((string *)peVar3);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d8,"per_fmol",
             (allocator<char> *)
             ((long)&u5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar3);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::create
            ((string *)
             &import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  libcellml::ImportSource::create();
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_320,"I_am_a_url",
             (allocator<char> *)
             ((long)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportSource::setUrl((string *)peVar5);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_300);
  libcellml::ImportSource::setModel((shared_ptr *)peVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_358,"env",
             (allocator<char> *)
             ((long)&v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create((string *)local_338);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_390,"v",&local_391);
  libcellml::Variable::create((string *)local_370);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator(&local_391);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&import.
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar3 + 0x10));
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&import.
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3b8,"per_sec_fmol",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::ImportedEntity::setImportReference((string *)(peVar3 + 0x10));
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar6 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_370);
  libcellml::Variable::setUnits((shared_ptr *)peVar6);
  peVar7 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_338);
  libcellml::Component::addVariable((shared_ptr *)peVar7);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_70);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_70);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar4);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_70);
  bVar1 = libcellml::Model::hasUnresolvedImports();
  local_3d1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d0,&local_3d1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar2) {
    testing::Message::Message(local_3e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)
               &i.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_3d0,"model->hasUnresolvedImports()","true");
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0xb5b,pcVar8);
    testing::internal::AssertHelper::operator=(local_3e8,local_3e0);
    testing::internal::AssertHelper::~AssertHelper(local_3e8);
    std::__cxx11::string::~string
              ((string *)
               &i.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    testing::Message::~Message(local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  libcellml::Importer::create
            (SUB81((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_418,0));
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_418);
  libcellml::Importer::flattenModel((shared_ptr *)importUnitsName);
  std::shared_ptr<libcellml::Importer>::~shared_ptr((shared_ptr<libcellml::Importer> *)local_418);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_370);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_338);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_300);
  std::shared_ptr<libcellml::Units>::~shared_ptr
            ((shared_ptr<libcellml::Units> *)
             &import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_268);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_1e0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_158);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_a8);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_70);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_28);
  MVar9.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar9.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)importUnitsName;
  return (ModelPtr)MVar9.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr prepareImportUnitsWithReferenceToNonStandardUnits(const std::string &importUnitsName)
{
    libcellml::ModelPtr unitsModel = libcellml::Model::create("Units_Database");
    libcellml::ModelPtr model = libcellml::Model::create("main_model");

    libcellml::UnitsPtr u1 = libcellml::Units::create("fmol");
    u1->addUnit("mole", "femto");
    libcellml::UnitsPtr u2 = libcellml::Units::create("per_fmol");
    u2->addUnit("fmol", -1.0);
    libcellml::UnitsPtr u3 = libcellml::Units::create("per_sec");
    u3->addUnit("second", -1.0);
    libcellml::UnitsPtr u4 = libcellml::Units::create("per_sec_fmol");
    u4->addUnit("per_sec");
    u4->addUnit("per_fmol");
    libcellml::UnitsPtr u5 = libcellml::Units::create(importUnitsName);

    unitsModel->addUnits(u1);
    unitsModel->addUnits(u2);
    unitsModel->addUnits(u3);
    unitsModel->addUnits(u4);

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");
    import->setModel(unitsModel);

    libcellml::ComponentPtr c = libcellml::Component::create("env");
    libcellml::VariablePtr v = libcellml::Variable::create("v");

    u5->setImportSource(import);
    u5->setImportReference("per_sec_fmol");

    v->setUnits(u5);
    c->addVariable(v);
    model->addUnits(u5);
    model->addComponent(c);

    EXPECT_FALSE(model->hasUnresolvedImports());

    libcellml::ImporterPtr i = libcellml::Importer::create();

    return i->flattenModel(model);
}